

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_examples.cpp
# Opt level: O3

void density_tests::
     SpQueueSamples<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1>::
     spinlocking_heterogeneous_queue_reentrant_put_transaction_samples(void)

{
  LfQueueControl *pLVar1;
  uintptr_t uVar2;
  void *pvVar3;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *psVar4;
  bool bVar5;
  int *piVar6;
  runtime_type<> *prVar7;
  type_info *ptVar8;
  size_t sVar9;
  double *pdVar10;
  char *pcVar11;
  reentrant_put_transaction<int> transaction1;
  type transaction2;
  int msg_2;
  reentrant_put_transaction<void> transaction2_1;
  int value_2;
  int msg_1;
  reentrant_put_transaction<void> transaction;
  Allocation __tmp;
  Allocation __tmp_1;
  Allocation __tmp_2;
  Allocation __tmp_3;
  Allocation __tmp_4;
  Allocation __tmp_5;
  reentrant_put_transaction<int> local_2a0;
  reentrant_put_transaction<int> local_280;
  double local_258;
  reentrant_put_transaction<int> local_250;
  int local_224;
  reentrant_put_transaction<int> local_220;
  undefined1 local_200 [64];
  atomic<density::detail::LfQueueControl_*> local_1c0;
  reentrant_put_transaction<int> local_150 [9];
  
  local_200._16_8_ = (__pointer_type)0x0;
  local_200._24_8_ =
       (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
        *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)local_200);
  local_200._0_8_ = (LfQueueControl *)0xffc0;
  LOCK();
  local_200[8] = false;
  UNLOCK();
  local_200._16_8_ = (__pointer_type)0x0;
  local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_220.m_put.m_control_block._0_4_ = 1;
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::start_reentrant_emplace<int,int>
            (&local_280,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)local_200,(int *)&local_220);
  local_250.m_put.m_control_block = local_280.m_put.m_control_block;
  local_250.m_put.m_next_ptr = local_280.m_put.m_next_ptr;
  local_250.m_put.m_user_storage = local_280.m_put.m_user_storage;
  local_250.m_queue = local_280.m_queue;
  local_280.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_280);
  local_2a0.m_put.m_control_block = local_250.m_put.m_control_block;
  local_2a0.m_put.m_next_ptr = local_250.m_put.m_next_ptr;
  local_2a0.m_put.m_user_storage = local_250.m_put.m_user_storage;
  local_2a0.m_queue = local_250.m_queue;
  local_250.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_250);
  local_280.m_put.m_control_block = local_2a0.m_put.m_control_block;
  local_280.m_put.m_next_ptr = local_2a0.m_put.m_next_ptr;
  local_280.m_put.m_user_storage = local_2a0.m_put.m_user_storage;
  local_280.m_queue = local_2a0.m_queue;
  local_2a0.m_put.m_user_storage = (void *)0x0;
  piVar6 = (int *)density::
                  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                  ::reentrant_put_transaction<int>::element_ptr(&local_280);
  if (*piVar6 != 1) {
    __assert_fail("transaction2.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x4f4,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::commit(&local_280);
  if (local_280.m_put.m_user_storage != (void *)0x0) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x4f8,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_280);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_2a0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)local_200);
  local_200._0_8_ = (LfQueueControl *)0xffc0;
  LOCK();
  local_200[8] = false;
  UNLOCK();
  local_200._16_8_ = (__pointer_type)0x0;
  local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_220.m_put.m_control_block =
       (LfQueueControl *)CONCAT44(local_220.m_put.m_control_block._4_4_,1);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::start_reentrant_emplace<int,int>
            (&local_280,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)local_200,(int *)&local_220);
  local_250.m_put.m_control_block = local_280.m_put.m_control_block;
  local_250.m_put.m_next_ptr = local_280.m_put.m_next_ptr;
  local_250.m_put.m_user_storage = local_280.m_put.m_user_storage;
  local_250.m_queue = local_280.m_queue;
  local_280.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_280);
  local_2a0.m_put.m_control_block = local_250.m_put.m_control_block;
  local_2a0.m_put.m_next_ptr = local_250.m_put.m_next_ptr;
  local_2a0.m_put.m_user_storage = local_250.m_put.m_user_storage;
  local_2a0.m_queue = local_250.m_queue;
  local_250.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_250);
  local_250.m_put.m_user_storage = (void *)0x0;
  local_250.m_queue =
       (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
        *)0x0;
  local_258._0_4_ = 1;
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::start_reentrant_emplace<int,int>
            (&local_280,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)local_200,(int *)&local_258);
  local_220.m_put.m_control_block = local_280.m_put.m_control_block;
  local_220.m_put.m_next_ptr = local_280.m_put.m_next_ptr;
  local_220.m_put.m_user_storage = local_280.m_put.m_user_storage;
  local_220.m_queue = local_280.m_queue;
  local_280.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_280);
  psVar4 = local_250.m_queue;
  pvVar3 = local_250.m_put.m_user_storage;
  uVar2 = local_250.m_put.m_next_ptr;
  pLVar1 = local_250.m_put.m_control_block;
  local_250.m_put.m_control_block = local_220.m_put.m_control_block;
  local_250.m_put.m_next_ptr = local_220.m_put.m_next_ptr;
  local_250.m_put.m_user_storage = local_220.m_put.m_user_storage;
  local_250.m_queue = local_220.m_queue;
  local_220.m_put.m_control_block = pLVar1;
  local_220.m_put.m_next_ptr = uVar2;
  local_220.m_put.m_user_storage = pvVar3;
  local_220.m_queue = psVar4;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_220);
  psVar4 = local_250.m_queue;
  pvVar3 = local_250.m_put.m_user_storage;
  uVar2 = local_250.m_put.m_next_ptr;
  pLVar1 = local_250.m_put.m_control_block;
  local_250.m_put.m_control_block = local_2a0.m_put.m_control_block;
  local_250.m_put.m_next_ptr = local_2a0.m_put.m_next_ptr;
  local_250.m_put.m_user_storage = local_2a0.m_put.m_user_storage;
  local_250.m_queue = local_2a0.m_queue;
  local_2a0.m_put.m_control_block = pLVar1;
  local_2a0.m_put.m_next_ptr = uVar2;
  local_2a0.m_put.m_user_storage = pvVar3;
  local_2a0.m_queue = psVar4;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::commit((reentrant_put_transaction<void> *)&local_250);
  if (local_250.m_put.m_user_storage != (void *)0x0) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x52b,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_250);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_2a0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)local_200);
  local_200._0_8_ = (LfQueueControl *)0xffc0;
  LOCK();
  local_200[8] = false;
  UNLOCK();
  local_200._16_8_ = (__pointer_type)0x0;
  local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_2a0.m_put.m_control_block = (LfQueueControl *)local_200;
  local_250.m_put.m_control_block = (LfQueueControl *)std::chrono::_V2::system_clock::now();
  local_220.m_put.m_control_block._0_4_ = 0x2a;
  local_258._0_4_ = 0x237;
  local_280.m_put.m_control_block = (LfQueueControl *)local_200;
  local_280.m_put.m_next_ptr = (uintptr_t)&local_250;
  spinlocking_heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::
  operator()((anon_class_8_1_a8890831 *)&local_2a0,&local_220,4);
  spinlocking_heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::
  operator()((anon_class_8_1_a8890831 *)&local_2a0,&local_258,4);
  spinlocking_heterogeneous_queue_reentrant_put_transaction_samples::anon_class_16_2_e5d92710::
  operator()((anon_class_16_2_e5d92710 *)&local_280);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)local_200);
  local_200._0_8_ = (LfQueueControl *)0xffc0;
  LOCK();
  local_200[8] = false;
  UNLOCK();
  local_200._16_8_ = (__pointer_type)0x0;
  local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)local_200);
  local_200._0_8_ = (LfQueueControl *)0xffc0;
  LOCK();
  local_200[8] = false;
  UNLOCK();
  local_200._16_8_ = (__pointer_type)0x0;
  local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)local_200);
  local_200._0_8_ = (LfQueueControl *)0xffc0;
  LOCK();
  local_200[8] = false;
  UNLOCK();
  local_200._16_8_ = (__pointer_type)0x0;
  local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_2a0.m_put.m_control_block = (LfQueueControl *)local_200;
  local_250.m_put.m_control_block = (LfQueueControl *)std::chrono::_V2::system_clock::now();
  local_220.m_put.m_control_block._0_4_ = 0x2a;
  local_258._0_4_ = 0x237;
  local_280.m_put.m_control_block = (LfQueueControl *)local_200;
  local_280.m_put.m_next_ptr = (uintptr_t)&local_250;
  spinlocking_heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::
  operator()((anon_class_8_1_a8890831 *)&local_2a0,&local_220,4);
  spinlocking_heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::
  operator()((anon_class_8_1_a8890831 *)&local_2a0,&local_258,4);
  spinlocking_heterogeneous_queue_reentrant_put_transaction_samples::anon_class_16_2_e5d92710::
  operator()((anon_class_16_2_e5d92710 *)&local_280);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)local_200);
  local_200._0_8_ = (LfQueueControl *)0xffc0;
  LOCK();
  local_200[8] = false;
  UNLOCK();
  local_200._16_8_ = (__pointer_type)0x0;
  local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)local_200);
  local_200._0_8_ = (LfQueueControl *)0xffc0;
  LOCK();
  local_200[8] = false;
  UNLOCK();
  local_200._16_8_ = (__pointer_type)0x0;
  local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)local_200);
  local_200._0_8_ = (LfQueueControl *)0xffc0;
  LOCK();
  local_200[8] = false;
  UNLOCK();
  local_200._16_8_ = (__pointer_type)0x0;
  local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_2a0.m_put.m_user_storage = (void *)0x0;
  local_2a0.m_queue =
       (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
        *)0x0;
  local_220.m_put.m_control_block._0_4_ = 1;
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::start_reentrant_emplace<int,int>
            (&local_280,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)local_200,(int *)&local_220);
  local_250.m_put.m_control_block = local_280.m_put.m_control_block;
  local_250.m_put.m_next_ptr = local_280.m_put.m_next_ptr;
  local_250.m_put.m_user_storage = local_280.m_put.m_user_storage;
  local_250.m_queue = local_280.m_queue;
  local_280.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_280);
  psVar4 = local_2a0.m_queue;
  pvVar3 = local_2a0.m_put.m_user_storage;
  uVar2 = local_2a0.m_put.m_next_ptr;
  pLVar1 = local_2a0.m_put.m_control_block;
  local_2a0.m_put.m_control_block = local_250.m_put.m_control_block;
  local_2a0.m_put.m_next_ptr = local_250.m_put.m_next_ptr;
  local_2a0.m_put.m_user_storage = local_250.m_put.m_user_storage;
  local_2a0.m_queue = local_250.m_queue;
  local_250.m_put.m_control_block = pLVar1;
  local_250.m_put.m_next_ptr = uVar2;
  local_250.m_put.m_user_storage = pvVar3;
  local_250.m_queue = psVar4;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_250);
  if (local_2a0.m_put.m_user_storage == (void *)0x0) {
    __assert_fail("!transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x61d,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_2a0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)local_200);
  local_200._0_8_ = (LfQueueControl *)0xffc0;
  LOCK();
  local_200[8] = false;
  UNLOCK();
  local_200._16_8_ = (__pointer_type)0x0;
  local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_2a0.m_put.m_user_storage = (void *)0x0;
  local_2a0.m_queue =
       (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
        *)0x0;
  local_220.m_put.m_control_block._0_4_ = 1;
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::start_reentrant_emplace<int,int>
            (&local_280,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)local_200,(int *)&local_220);
  local_250.m_put.m_control_block = local_280.m_put.m_control_block;
  local_250.m_put.m_next_ptr = local_280.m_put.m_next_ptr;
  local_250.m_put.m_user_storage = local_280.m_put.m_user_storage;
  local_250.m_queue = local_280.m_queue;
  local_280.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_280);
  psVar4 = local_2a0.m_queue;
  pvVar3 = local_2a0.m_put.m_user_storage;
  uVar2 = local_2a0.m_put.m_next_ptr;
  pLVar1 = local_2a0.m_put.m_control_block;
  local_2a0.m_put.m_control_block = local_250.m_put.m_control_block;
  local_2a0.m_put.m_next_ptr = local_250.m_put.m_next_ptr;
  local_2a0.m_put.m_user_storage = local_250.m_put.m_user_storage;
  local_2a0.m_queue = local_250.m_queue;
  local_250.m_put.m_control_block = pLVar1;
  local_250.m_put.m_next_ptr = uVar2;
  local_250.m_put.m_user_storage = pvVar3;
  local_250.m_queue = psVar4;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_250);
  if (local_2a0.m_put.m_user_storage == (void *)0x0) {
    __assert_fail("transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x62b,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_2a0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)local_200);
  local_200._0_8_ = (LfQueueControl *)0xffc0;
  LOCK();
  local_200[8] = false;
  UNLOCK();
  local_200._16_8_ = (__pointer_type)0x0;
  local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_2a0.m_put.m_user_storage = (void *)0x0;
  local_2a0.m_queue =
       (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
        *)0x0;
  local_220.m_put.m_control_block._0_4_ = 1;
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::start_reentrant_emplace<int,int>
            (&local_280,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)local_200,(int *)&local_220);
  local_250.m_put.m_control_block = local_280.m_put.m_control_block;
  local_250.m_put.m_next_ptr = local_280.m_put.m_next_ptr;
  local_250.m_put.m_user_storage = local_280.m_put.m_user_storage;
  local_250.m_queue = local_280.m_queue;
  local_280.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_280);
  psVar4 = local_2a0.m_queue;
  pvVar3 = local_2a0.m_put.m_user_storage;
  uVar2 = local_2a0.m_put.m_next_ptr;
  pLVar1 = local_2a0.m_put.m_control_block;
  local_2a0.m_put.m_control_block = local_250.m_put.m_control_block;
  local_2a0.m_put.m_next_ptr = local_250.m_put.m_next_ptr;
  local_2a0.m_put.m_user_storage = local_250.m_put.m_user_storage;
  local_2a0.m_queue = local_250.m_queue;
  local_250.m_put.m_control_block = pLVar1;
  local_250.m_put.m_next_ptr = uVar2;
  local_250.m_put.m_user_storage = pvVar3;
  local_250.m_queue = psVar4;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_250);
  if ((local_2a0.m_put.m_user_storage == (void *)0x0) ||
     ((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
       *)local_2a0.m_queue !=
      (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
       *)local_200)) {
    __assert_fail("transaction.queue() == &queue",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x639,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_2a0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)local_200);
  local_200._0_8_ = (LfQueueControl *)0xffc0;
  LOCK();
  local_200[8] = false;
  UNLOCK();
  local_200._16_8_ = (__pointer_type)0x0;
  local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
  bVar5 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::empty((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                   *)local_200);
  if (!bVar5) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x644,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  local_220.m_put.m_control_block._0_4_ = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::start_reentrant_emplace<int,int>
            (&local_280,
             (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)local_200,(int *)&local_220);
  local_250.m_put.m_control_block = local_280.m_put.m_control_block;
  local_250.m_put.m_next_ptr = local_280.m_put.m_next_ptr;
  local_250.m_put.m_user_storage = local_280.m_put.m_user_storage;
  local_250.m_queue = local_280.m_queue;
  local_280.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_280);
  local_2a0.m_put.m_control_block = local_250.m_put.m_control_block;
  local_2a0.m_put.m_next_ptr = local_250.m_put.m_next_ptr;
  local_2a0.m_put.m_user_storage = local_250.m_put.m_user_storage;
  local_2a0.m_queue = local_250.m_queue;
  local_250.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_250);
  if (local_2a0.m_put.m_user_storage != (void *)0x0) {
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<int>::cancel(&local_2a0);
    bVar5 = density::
            sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
            ::empty((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)local_200);
    if ((!bVar5) || (local_2a0.m_put.m_user_storage != (void *)0x0)) {
      __assert_fail("queue.empty() && put.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                    ,0x64a,
                    "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                   );
    }
    local_220.m_put.m_control_block =
         (LfQueueControl *)CONCAT44(local_220.m_put.m_control_block._4_4_,0x2a);
    density::
    sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
    ::start_reentrant_emplace<int,int>
              (&local_280,
               (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                *)local_200,(int *)&local_220);
    local_250.m_put.m_control_block = local_280.m_put.m_control_block;
    local_250.m_put.m_next_ptr = local_280.m_put.m_next_ptr;
    local_250.m_put.m_user_storage = local_280.m_put.m_user_storage;
    local_250.m_queue = local_280.m_queue;
    local_280.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_280);
    psVar4 = local_2a0.m_queue;
    pvVar3 = local_2a0.m_put.m_user_storage;
    uVar2 = local_2a0.m_put.m_next_ptr;
    pLVar1 = local_2a0.m_put.m_control_block;
    local_2a0.m_put.m_control_block = local_250.m_put.m_control_block;
    local_2a0.m_put.m_next_ptr = local_250.m_put.m_next_ptr;
    local_2a0.m_put.m_user_storage = local_250.m_put.m_user_storage;
    local_2a0.m_queue = local_250.m_queue;
    local_250.m_put.m_control_block = pLVar1;
    local_250.m_put.m_next_ptr = uVar2;
    local_250.m_put.m_user_storage = pvVar3;
    local_250.m_queue = psVar4;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_250);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<int>::commit(&local_2a0);
    local_280.m_put.m_user_storage = (void *)0x0;
    local_280.m_put.m_control_block = (LfQueueControl *)0x0;
    local_280.m_put.m_next_ptr = 0;
    density::detail::
    LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
    ::Consume::start_consume_impl
              ((Consume *)&local_280,
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *)local_200);
    piVar6 = density::
             sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
             ::reentrant_consume_operation::element<int>((reentrant_consume_operation *)&local_280);
    if (*piVar6 != 0x2a) {
      __assert_fail("queue.try_start_reentrant_consume().template element<int>() == 42",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                    ,0x64f,
                    "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                   );
    }
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_consume_operation::~reentrant_consume_operation
              ((reentrant_consume_operation *)&local_280);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_2a0);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                       *)local_200);
    local_200._0_8_ = (LfQueueControl *)0xffc0;
    LOCK();
    local_200[8] = false;
    UNLOCK();
    local_200._16_8_ = (__pointer_type)0x0;
    local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_258 = (double)CONCAT44(local_258._4_4_,0x2a);
    local_250.m_put.m_control_block =
         (LfQueueControl *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
         ::s_table;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::start_reentrant_dyn_push_copy
              ((reentrant_put_transaction<void> *)&local_280,
               (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                *)local_200,(runtime_type *)&local_250,&local_258);
    local_2a0.m_put.m_control_block = local_280.m_put.m_control_block;
    local_2a0.m_put.m_next_ptr = local_280.m_put.m_next_ptr;
    local_2a0.m_put.m_user_storage = local_280.m_put.m_user_storage;
    local_2a0.m_queue = local_280.m_queue;
    local_280.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)&local_280);
    piVar6 = (int *)density::
                    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                    ::reentrant_put_transaction<void>::element_ptr
                              ((reentrant_put_transaction<void> *)&local_2a0);
    if (*piVar6 != 0x2a) {
      __assert_fail("*static_cast<int *>(put.element_ptr()) == 42",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                    ,0x65c,
                    "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                   );
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Putting an ",0xb);
    prVar7 = density::
             sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
             ::reentrant_put_transaction<void>::complete_type
                       ((reentrant_put_transaction<void> *)&local_2a0);
    ptVar8 = density::runtime_type<>::type_info(prVar7);
    pcVar11 = *(char **)(ptVar8 + 8) + (**(char **)(ptVar8 + 8) == '*');
    sVar9 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::commit((reentrant_put_transaction<void> *)&local_2a0);
    local_224 = 1;
    density::
    sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
    ::start_reentrant_emplace<int,int>
              (&local_280,
               (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                *)local_200,&local_224);
    psVar4 = local_280.m_queue;
    local_220.m_put.m_user_storage = local_280.m_put.m_user_storage;
    local_220.m_put.m_control_block = local_280.m_put.m_control_block;
    local_220.m_put.m_next_ptr = local_280.m_put.m_next_ptr;
    local_220.m_queue = local_280.m_queue;
    local_280.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_280);
    local_250.m_put.m_control_block = local_220.m_put.m_control_block;
    local_250.m_put.m_next_ptr = local_220.m_put.m_next_ptr;
    local_250.m_put.m_user_storage = local_220.m_put.m_user_storage;
    local_250.m_queue = psVar4;
    local_220.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_220);
    piVar6 = (int *)density::
                    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                    ::reentrant_put_transaction<int>::element_ptr(&local_250);
    if (*piVar6 != 1) {
      __assert_fail("*static_cast<int *>(put_1.element_ptr()) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                    ,0x663,
                    "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                   );
    }
    piVar6 = (int *)density::
                    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                    ::reentrant_put_transaction<int>::element_ptr(&local_250);
    if (*piVar6 != 1) {
      __assert_fail("put_1.element() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                    ,0x664,
                    "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                   );
    }
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<int>::commit(&local_250);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_250);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)&local_2a0);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                       *)local_200);
    local_200._0_8_ = (LfQueueControl *)0xffc0;
    LOCK();
    local_200[8] = false;
    UNLOCK();
    local_200._16_8_ = (__pointer_type)0x0;
    local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_220.m_put.m_control_block =
         (LfQueueControl *)CONCAT44(local_220.m_put.m_control_block._4_4_,0x2a);
    local_250.m_put.m_control_block =
         (LfQueueControl *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
         ::s_table;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::start_reentrant_dyn_push_copy
              ((reentrant_put_transaction<void> *)&local_2a0,
               (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                *)local_200,(runtime_type *)&local_250,&local_220);
    local_280.m_put.m_control_block = local_2a0.m_put.m_control_block;
    local_280.m_put.m_next_ptr = local_2a0.m_put.m_next_ptr;
    local_280.m_put.m_user_storage = local_2a0.m_put.m_user_storage;
    local_280.m_queue = local_2a0.m_queue;
    local_2a0.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)&local_2a0);
    prVar7 = density::
             sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
             ::reentrant_put_transaction<void>::complete_type
                       ((reentrant_put_transaction<void> *)&local_280);
    if (prVar7->m_feature_table !=
        (tuple_type *)
        density::detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
        ::s_table) {
      __assert_fail("put.complete_type().template is<int>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                    ,0x672,
                    "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                   );
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Putting an ",0xb);
    prVar7 = density::
             sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
             ::reentrant_put_transaction<void>::complete_type
                       ((reentrant_put_transaction<void> *)&local_280);
    ptVar8 = density::runtime_type<>::type_info(prVar7);
    pcVar11 = *(char **)(ptVar8 + 8) + (**(char **)(ptVar8 + 8) == '*');
    sVar9 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)&local_280);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                       *)local_200);
    local_200._0_8_ = (LfQueueControl *)0xffc0;
    LOCK();
    local_200[8] = false;
    UNLOCK();
    local_200._16_8_ = (__pointer_type)0x0;
    local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_2a0.m_put.m_control_block =
         (LfQueueControl *)CONCAT44(local_2a0.m_put.m_control_block._4_4_,0x2a);
    density::
    sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
    ::start_reentrant_emplace<int,int>
              (&local_280,
               (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                *)local_200,(int *)&local_2a0);
    local_150[0].m_put.m_control_block = local_280.m_put.m_control_block;
    local_150[0].m_put.m_next_ptr = local_280.m_put.m_next_ptr;
    local_150[0].m_put.m_user_storage = local_280.m_put.m_user_storage;
    local_150[0].m_queue = local_280.m_queue;
    local_280.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_280);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<int>::~reentrant_put_transaction(local_150);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                       *)local_200);
    local_200._0_8_ = (LfQueueControl *)0xffc0;
    LOCK();
    local_200[8] = false;
    UNLOCK();
    local_200._16_8_ = (__pointer_type)0x0;
    local_1c0._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_224 = 0x2a;
    local_250.m_put.m_control_block =
         (LfQueueControl *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
         ::s_table;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::start_reentrant_dyn_push_copy
              ((reentrant_put_transaction<void> *)&local_280,
               (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                *)local_200,(runtime_type *)&local_250,&local_224);
    local_2a0.m_put.m_control_block = local_280.m_put.m_control_block;
    local_2a0.m_put.m_next_ptr = local_280.m_put.m_next_ptr;
    local_2a0.m_put.m_user_storage = local_280.m_put.m_user_storage;
    local_2a0.m_queue = local_280.m_queue;
    local_280.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)&local_280);
    local_258 = 42.0;
    density::
    sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
    ::start_reentrant_emplace<double,double>
              ((reentrant_put_transaction<double> *)&local_280,
               (sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                *)local_200,&local_258);
    psVar4 = local_280.m_queue;
    local_220.m_put.m_user_storage = local_280.m_put.m_user_storage;
    local_220.m_put.m_control_block = local_280.m_put.m_control_block;
    local_220.m_put.m_next_ptr = local_280.m_put.m_next_ptr;
    local_220.m_queue = local_280.m_queue;
    local_280.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<double>::~reentrant_put_transaction
              ((reentrant_put_transaction<double> *)&local_280);
    local_250.m_put.m_control_block = local_220.m_put.m_control_block;
    local_250.m_put.m_next_ptr = local_220.m_put.m_next_ptr;
    local_250.m_put.m_user_storage = local_220.m_put.m_user_storage;
    local_250.m_queue = psVar4;
    local_220.m_put.m_user_storage = (void *)0x0;
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<double>::~reentrant_put_transaction
              ((reentrant_put_transaction<double> *)&local_220);
    pdVar10 = (double *)
              density::
              sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
              ::reentrant_put_transaction<double>::element_ptr
                        ((reentrant_put_transaction<double> *)&local_250);
    if ((*pdVar10 == 42.0) && (!NAN(*pdVar10))) {
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::reentrant_put_transaction<double>::~reentrant_put_transaction
                ((reentrant_put_transaction<double> *)&local_250);
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::reentrant_put_transaction<void>::~reentrant_put_transaction
                ((reentrant_put_transaction<void> *)&local_2a0);
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                         *)local_200);
      return;
    }
    __assert_fail("typed_put.element() == 42.",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x690,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  __assert_fail("!put.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                ,0x648,
                "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
               );
}

Assistant:

static void spinlocking_heterogeneous_queue_reentrant_put_transaction_samples()
{
    using namespace density;

    {
        //! [sp_heter_queue reentrant_put_transaction default_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        typename SpQueue::template reentrant_put_transaction<> transaction;
        assert(transaction.empty());
        //! [sp_heter_queue reentrant_put_transaction default_construct example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction copy_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;
        using SpQueueInt =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        static_assert(
          !std::is_copy_constructible<
            typename SpQueue::template reentrant_put_transaction<>>::value,
          "");
        static_assert(
          !std::is_copy_constructible<
            typename SpQueueInt::template reentrant_put_transaction<>>::value,
          "");
        //! [sp_heter_queue reentrant_put_transaction copy_construct example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction copy_assign example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;
        using SpQueueInt =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        static_assert(
          !std::is_copy_assignable<typename SpQueue::template reentrant_put_transaction<>>::value,
          "");
        static_assert(
          !std::is_copy_assignable<
            typename SpQueueInt::template reentrant_put_transaction<>>::value,
          "");
        //! [sp_heter_queue reentrant_put_transaction copy_assign example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction move_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        auto    transaction1 = queue.start_reentrant_push(1);

        // move from transaction1 to transaction2
        auto transaction2(std::move(transaction1));
        assert(transaction1.empty());
        assert(transaction2.element() == 1);

        // commit transaction2
        transaction2.commit();
        assert(transaction2.empty());

        //! [sp_heter_queue reentrant_put_transaction move_construct example 1]

        //! [sp_heter_queue reentrant_put_transaction move_construct example 2]

        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        // reentrant_put_transaction<void> can be move constructed from any reentrant_put_transaction<T>
        static_assert(
          std::is_constructible<
            typename SpQueue::template reentrant_put_transaction<void>,
            typename SpQueue::template reentrant_put_transaction<void> &&>::value,
          "");
        static_assert(
          std::is_constructible<
            typename SpQueue::template reentrant_put_transaction<void>,
            typename SpQueue::template reentrant_put_transaction<int> &&>::value,
          "");

        // reentrant_put_transaction<T> can be move constructed only from reentrant_put_transaction<T>
        static_assert(
          !std::is_constructible<
            typename SpQueue::template reentrant_put_transaction<int>,
            typename SpQueue::template reentrant_put_transaction<void> &&>::value,
          "");
        static_assert(
          !std::is_constructible<
            typename SpQueue::template reentrant_put_transaction<int>,
            typename SpQueue::template reentrant_put_transaction<float> &&>::value,
          "");
        static_assert(
          std::is_constructible<
            typename SpQueue::template reentrant_put_transaction<int>,
            typename SpQueue::template reentrant_put_transaction<int> &&>::value,
          "");
        //! [sp_heter_queue reentrant_put_transaction move_construct example 2]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction move_assign example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        auto    transaction1 = queue.start_reentrant_push(1);

        typename SpQueue::template reentrant_put_transaction<> transaction2;
        transaction2 = queue.start_reentrant_push(1);
        transaction2 = std::move(transaction1);
        transaction2.commit();
        assert(transaction2.empty());
        //! [sp_heter_queue reentrant_put_transaction move_assign example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction move_assign example 2]
        // reentrant_put_transaction<void> can be move assigned from any reentrant_put_transaction<T>
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        static_assert(
          std::is_assignable<
            typename SpQueue::template reentrant_put_transaction<void>,
            typename SpQueue::template reentrant_put_transaction<void> &&>::value,
          "");
        static_assert(
          std::is_assignable<
            typename SpQueue::template reentrant_put_transaction<void>,
            typename SpQueue::template reentrant_put_transaction<int> &&>::value,
          "");

        // reentrant_put_transaction<T> can be move assigned only from reentrant_put_transaction<T>
        static_assert(
          !std::is_assignable<
            typename SpQueue::template reentrant_put_transaction<int>,
            typename SpQueue::template reentrant_put_transaction<void> &&>::value,
          "");
        static_assert(
          !std::is_assignable<
            typename SpQueue::template reentrant_put_transaction<int>,
            typename SpQueue::template reentrant_put_transaction<float> &&>::value,
          "");
        static_assert(
          std::is_assignable<
            typename SpQueue::template reentrant_put_transaction<int>,
            typename SpQueue::template reentrant_put_transaction<int> &&>::value,
          "");
        //! [sp_heter_queue reentrant_put_transaction move_assign example 2]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction raw_allocate example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        struct Msg
        {
            std::chrono::high_resolution_clock::time_point m_time =
              std::chrono::high_resolution_clock::now();
            size_t m_len  = 0;
            void * m_data = nullptr;
        };

        auto post_message = [&queue](const void * i_data, size_t i_len) {
            auto transaction             = queue.template start_reentrant_emplace<Msg>();
            transaction.element().m_len  = i_len;
            transaction.element().m_data = transaction.raw_allocate(i_len, 1);
            memcpy(transaction.element().m_data, i_data, i_len);

            assert(
              !transaction
                 .empty()); // a put transaction is not empty if it's bound to an element being put
            transaction.commit();
            assert(transaction.empty()); // the commit makes the transaction empty
        };

        auto const start_time = std::chrono::high_resolution_clock::now();

        auto consume_all_msgs = [&queue, &start_time] {
            while (auto consume = queue.try_start_reentrant_consume())
            {
                auto const & msg      = consume.template element<Msg>();
                auto const   checksum = compute_checksum(msg.m_data, msg.m_len);
                std::cout << "Message with checksum " << checksum << " at ";
                std::cout << (msg.m_time - start_time).count() << std::endl;
                consume.commit();
            }
        };

        int msg_1 = 42, msg_2 = 567;
        post_message(&msg_1, sizeof(msg_1));
        post_message(&msg_2, sizeof(msg_2));

        consume_all_msgs();
        //! [sp_heter_queue reentrant_put_transaction raw_allocate example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction raw_allocate_copy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        struct Msg
        {
            size_t m_len   = 0;
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const char * i_data, size_t i_len) {
            auto transaction              = queue.template start_reentrant_emplace<Msg>();
            transaction.element().m_len   = i_len;
            transaction.element().m_chars = transaction.raw_allocate_copy(i_data, i_data + i_len);
            memcpy(transaction.element().m_chars, i_data, i_len);
            transaction.commit();
        };
        //! [sp_heter_queue reentrant_put_transaction raw_allocate_copy example 1]
        (void)post_message;
    }
    {
        //! [sp_heter_queue reentrant_put_transaction raw_allocate_copy example 2]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        struct Msg
        {
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const std::string & i_string) {
            auto transaction              = queue.template start_reentrant_emplace<Msg>();
            transaction.element().m_chars = transaction.raw_allocate_copy(i_string);
            transaction.commit();
        };
        //! [sp_heter_queue reentrant_put_transaction raw_allocate_copy example 2]
        (void)post_message;
    }
    {
        //! [sp_heter_queue reentrant_put_transaction try_raw_allocate example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;
        SpQueue queue;
        struct Msg
        {
            std::chrono::high_resolution_clock::time_point m_time =
              std::chrono::high_resolution_clock::now();
            size_t m_len  = 0;
            void * m_data = nullptr;
        };

        auto post_message = [&queue](const void * i_data, size_t i_len) {
            if (
              auto transaction =
                queue.template try_start_reentrant_emplace<Msg>(progress_lock_free))
            {
                // if we fail to allocate the raw block, we don't commit the put transaction
                transaction.element().m_len = i_len;
                transaction.element().m_data =
                  transaction.try_raw_allocate(progress_lock_free, i_len, 1);
                if (transaction.element().m_data)
                {
                    memcpy(transaction.element().m_data, i_data, i_len);

                    assert(
                      !transaction
                         .empty()); // a put transaction is not empty if it's bound to an element being put
                    transaction.commit();
                    assert(transaction.empty()); // the commit makes the transaction empty
                }
            }
        };

        auto const start_time = std::chrono::high_resolution_clock::now();

        auto consume_all_msgs = [&queue, &start_time] {
            while (auto consume = queue.try_start_consume())
            {
                auto const & msg      = consume.template element<Msg>();
                auto const   checksum = compute_checksum(msg.m_data, msg.m_len);
                std::cout << "Message with checksum " << checksum << " at ";
                std::cout << (msg.m_time - start_time).count() << std::endl;
                consume.commit();
            }
        };

        int msg_1 = 42, msg_2 = 567;
        post_message(&msg_1, sizeof(msg_1));
        post_message(&msg_2, sizeof(msg_2));

        consume_all_msgs();
        //! [sp_heter_queue reentrant_put_transaction try_raw_allocate example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction try_raw_allocate_copy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        struct Msg
        {
            size_t m_len   = 0;
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const char * i_data, size_t i_len) {
            auto transaction = queue.template try_start_reentrant_emplace<Msg>(progress_lock_free);

            // if we fail to allocate the raw block, we don't commit the put transaction
            transaction.element().m_len = i_len;
            transaction.element().m_chars =
              transaction.try_raw_allocate_copy(progress_lock_free, i_data, i_data + i_len);
            if (transaction.element().m_chars)
            {
                memcpy(transaction.element().m_chars, i_data, i_len);
                transaction.commit();
            }
        };
        //! [sp_heter_queue reentrant_put_transaction try_raw_allocate_copy example 1]
        (void)post_message;
    }
    {
        //! [sp_heter_queue reentrant_put_transaction try_raw_allocate_copy example 2]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        struct Msg
        {
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const std::string & i_string) {
            auto transaction = queue.template try_start_reentrant_emplace<Msg>(progress_lock_free);

            // if we fail to allocate the raw block, we don't commit the put transaction
            transaction.element().m_chars =
              transaction.try_raw_allocate_copy(progress_lock_free, i_string);
            if (transaction.element().m_chars)
            {
                transaction.commit();
            }
        };
        //! [sp_heter_queue reentrant_put_transaction try_raw_allocate_copy example 2]
        (void)post_message;
    }
    {
        //! [sp_heter_queue reentrant_put_transaction empty example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue                                                queue;
        typename SpQueue::template reentrant_put_transaction<> transaction;
        assert(transaction.empty());

        transaction = queue.start_reentrant_push(1);
        assert(!transaction.empty());
        //! [sp_heter_queue reentrant_put_transaction empty example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction operator_bool example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        typename SpQueue::template reentrant_put_transaction<> transaction;
        assert(!transaction);

        transaction = queue.start_reentrant_push(1);
        assert(transaction);
        //! [sp_heter_queue reentrant_put_transaction operator_bool example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction queue example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        typename SpQueue::template reentrant_put_transaction<> transaction;
        assert(transaction.queue() == nullptr);

        transaction = queue.start_reentrant_push(1);
        assert(transaction.queue() == &queue);
        //! [sp_heter_queue reentrant_put_transaction queue example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction cancel example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        // start and cancel a put
        assert(queue.empty());
        auto put = queue.start_reentrant_push(42);
        /* assert(queue.empty()); <- this assert would trigger an undefined behavior, because it would access
                the queue during a non-reentrant put transaction. */
        assert(!put.empty());
        put.cancel();
        assert(queue.empty() && put.empty());

        // start and commit a put
        put = queue.start_reentrant_push(42);
        put.commit();
        assert(queue.try_start_reentrant_consume().template element<int>() == 42);
        //! [sp_heter_queue reentrant_put_transaction cancel example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction element_ptr example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        int  value = 42;
        auto put =
          queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
        assert(*static_cast<int *>(put.element_ptr()) == 42);
        std::cout << "Putting an " << put.complete_type().type_info().name() << "..." << std::endl;
        put.commit();
        //! [sp_heter_queue reentrant_put_transaction element_ptr example 1]

        //! [sp_heter_queue reentrant_put_transaction element_ptr example 2]
        auto put_1 = queue.start_reentrant_push(1);
        assert(*static_cast<int *>(put_1.element_ptr()) == 1); // this is fine
        assert(put_1.element() == 1);                          // this is better
        put_1.commit();
        //! [sp_heter_queue reentrant_put_transaction element_ptr example 2]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction complete_type example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        int  value = 42;
        auto put =
          queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
        assert(put.complete_type().template is<int>());
        std::cout << "Putting an " << put.complete_type().type_info().name() << "..." << std::endl;
        //! [sp_heter_queue reentrant_put_transaction complete_type example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction destroy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.start_reentrant_push(42); /* this transaction is destroyed without being committed,
                                    so it gets canceled automatically. */
        //! [sp_heter_queue reentrant_put_transaction destroy example 1]
    }
    {
        //! [sp_heter_queue reentrant_typed_put_transaction element example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        int  value = 42;
        auto untyped_put =
          queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);

        auto typed_put = queue.start_reentrant_push(42.);

        /* typed_put = std::move(untyped_put); <- this would not compile: can't assign an untyped
                transaction to a typed transaction */

        assert(typed_put.element() == 42.);

        //! [sp_heter_queue reentrant_typed_put_transaction element example 1]
    }
}